

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O1

void __thiscall ON_PointGrid::ON_PointGrid(ON_PointGrid *this,int c0,int c1)

{
  ON_Object::ON_Object((ON_Object *)this);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00826900;
  ON_3dPointArray::ON_3dPointArray(&this->m_point);
  this->m_point_count[0] = 0;
  this->m_point_count[1] = 0;
  this->m_point_stride0 = 0;
  if (-1 < (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
    (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_count = 0;
  }
  Create(this,c0,c1);
  return;
}

Assistant:

ON_PointGrid::ON_PointGrid( int c0, int c1 )
{
  Initialize();
  Create(c0,c1);
}